

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Acknowledge_PDU::Encode(Acknowledge_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16AcknowledgeFlag);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16ResponseFlag);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RequestID);
  return;
}

Assistant:

void Acknowledge_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << m_ui16AcknowledgeFlag
           << m_ui16ResponseFlag
           << m_ui32RequestID;
}